

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O3

void __thiscall
dg::vr::RelationsAnalyzer::inferFromNonEquality
          (RelationsAnalyzer *this,VRLocation *join,VectorSet<const_llvm::Value_*> *froms,Shift s,
          Handle placeholder)

{
  bool *pbVar1;
  Instruction *ptr;
  byte bVar2;
  ValueRelations *this_00;
  V pVVar3;
  bool bVar4;
  Type TVar5;
  VRLocation *pVVar6;
  HandlePtr pBVar7;
  Argument *pAVar8;
  Function *f;
  VectorSet<const_llvm::Value_*> *pVVar9;
  Relations RVar10;
  vector<dg::vr::BorderValue,_std::allocator<dg::vr::BorderValue>_> *pvVar11;
  size_t id;
  Bucket *lt;
  V val;
  pointer pBVar12;
  bool *pbVar13;
  ValueRelations *pVVar14;
  pointer ppIVar15;
  pair<const_llvm::Value_*,_bool> pVar16;
  pair<std::reference_wrapper<const_dg::vr::Bucket>,_bool> pVar17;
  V compared;
  Argument *arg;
  V local_d8;
  Type local_cc;
  Argument *local_c8;
  bool *local_c0;
  Handle local_b8;
  ValueRelations *local_b0;
  RelationsAnalyzer *local_a8;
  V local_a0;
  Type local_94;
  VRLocation *local_90;
  ValueRelations *local_88;
  ValueRelations *local_80;
  Bucket *local_78;
  pointer local_70;
  pointer local_68;
  long local_60;
  pointer local_58;
  key_type local_50;
  vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_> local_48;
  
  local_b8 = placeholder;
  local_90 = join;
  pVVar6 = VRLocation::getTreePredecessor(join);
  local_68 = (froms->vec).
             super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_70 = (froms->vec).
             super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (local_68 != local_70) {
    pVVar14 = &pVVar6->relations;
    local_cc = (uint)(s != INC) * 4 + SLE;
    local_60 = 1L << (sbyte)local_cc;
    local_88 = &local_90->relations;
    local_94 = (uint)(s != INC) * 4 + SLT;
    local_c0 = &(local_90->relations).changed;
    local_b0 = pVVar14;
    local_a8 = this;
    do {
      val = *local_68;
      pBVar7 = ValueRelations::maybeGet(pVVar14,val);
      local_78 = ((pBVar7->relatedBuckets)._M_elems[10].vec.
                  super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_data;
      getEQICmp(&local_48,this,local_90);
      local_58 = local_48.
                 super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      ppIVar15 = local_48.
                 super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pVVar3 = val;
      if (local_48.
          super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          local_48.
          super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        bVar2 = 0;
      }
      else {
        do {
          local_a0 = pVVar3;
          ptr = (Instruction *)*ppIVar15;
          pVVar6 = VRCodeGraph::getVRLocation(*(VRCodeGraph **)(this + 0x38),ptr);
          pVar16 = getCompared(&pVVar6->relations,(ICmpInst *)ptr,val);
          local_d8 = pVar16.first;
          if (local_d8 != (Value *)0x0) {
            if (0x13 < (byte)local_d8[0x10]) {
              pVVar6 = VRCodeGraph::getVRLocation(*(VRCodeGraph **)(this + 0x38),ptr);
              pAVar8 = ValueRelations::getInstance<llvm::Argument>(&pVVar6->relations,local_d8);
              if (pAVar8 == (Argument *)0x0) goto LAB_0011fb83;
            }
            local_c8 = getArgument(pVVar14,local_78);
            if (local_c8 != (Argument *)0x0) {
              f = (Function *)llvm::Instruction::getFunction();
              pVVar6 = VRCodeGraph::getEntryLocation(*(VRCodeGraph **)(this + 0x38),f);
              local_80 = &pVVar6->relations;
              if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                bVar4 = StructureAnalyzer::hasBorderValues(*(StructureAnalyzer **)(this + 0x40),f);
                if (bVar4) {
                  pvVar11 = StructureAnalyzer::getBorderValuesFor
                                      (*(StructureAnalyzer **)(this + 0x40),f);
                  this_00 = local_88;
                  for (pBVar12 = (pvVar11->
                                 super__Vector_base<dg::vr::BorderValue,_std::allocator<dg::vr::BorderValue>_>
                                 )._M_impl.super__Vector_impl_data._M_start;
                      pBVar12 !=
                      (pvVar11->
                      super__Vector_base<dg::vr::BorderValue,_std::allocator<dg::vr::BorderValue>_>)
                      ._M_impl.super__Vector_impl_data._M_finish; pBVar12 = pBVar12 + 1) {
                    if ((pBVar12->from == local_c8) && (pBVar12->stored == local_d8)) {
                      pBVar7 = ValueRelations::getBorderH(local_88,pBVar12->id);
                      bVar4 = RelationsGraph<dg::vr::ValueRelations>::addRelation
                                        (&this_00->graph,local_b8,local_cc,pBVar7,(Relations *)0x0);
                      *local_c0 = (bool)(*local_c0 | bVar4);
                      bVar2 = 1;
                      this = local_a8;
                      goto LAB_0011fbd5;
                    }
                  }
                }
                id = StructureAnalyzer::addBorderValue
                               (*(StructureAnalyzer **)(local_a8 + 0x40),f,local_c8,local_d8);
                pVVar14 = local_80;
                lt = RelationsGraph<dg::vr::ValueRelations>::getBorderBucket(&local_80->graph,id);
                local_50._M_data = lt;
                std::
                map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
                ::operator[](&(pVVar6->relations).bucketToVals,&local_50);
                pVar17 = ValueRelations::get(pVVar14,local_d8);
                bVar4 = RelationsGraph<dg::vr::ValueRelations>::addRelation
                                  (&pVVar14->graph,lt,PT,pVar17.first._M_data._M_data,
                                   (Relations *)0x0);
                this = local_a8;
                pbVar13 = &(pVVar6->relations).changed;
                pbVar1 = &(pVVar6->relations).changed;
                *pbVar1 = (bool)(*pbVar1 | bVar4);
                TVar5 = dg::vr::Relations::inverted(local_cc);
                pVar17 = ValueRelations::get(pVVar14,(V)local_c8);
                bVar4 = RelationsGraph<dg::vr::ValueRelations>::addRelation
                                  (&pVVar14->graph,lt,TVar5,pVar17.first._M_data._M_data,
                                   (Relations *)0x0);
              }
              else {
                pVVar9 = ValueRelations::getEqual(pVVar14,local_78);
                pVVar14 = local_88;
                RVar10 = ValueRelations::_between
                                   (local_88,*(pVVar9->vec).
                                              super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                                              ._M_impl.super__Vector_impl_data._M_start,local_d8);
                TVar5 = local_cc;
                if (((uint)local_60 & (uint)RVar10.bits.super__Base_bitset<1UL>._M_w) == 0) {
                  StructureAnalyzer::addPrecondition
                            (*(StructureAnalyzer **)(this + 0x40),f,local_c8,local_cc,local_d8);
                  ValueRelations::set<llvm::Argument_const*,llvm::Value_const*>
                            (local_80,&local_c8,TVar5,&local_d8);
                }
                RVar10 = ValueRelations::_between(pVVar14,(V)local_c8,local_d8);
                pVar17 = ValueRelations::get(pVVar14,local_d8);
                TVar5 = local_94;
                if (((ulong)RVar10.bits.super__Base_bitset<1UL>._M_w & 2) == 0) {
                  TVar5 = local_cc;
                }
                bVar4 = RelationsGraph<dg::vr::ValueRelations>::addRelation
                                  (&pVVar14->graph,local_b8,TVar5,pVar17.first._M_data._M_data,
                                   (Relations *)0x0);
                pbVar13 = local_c0;
              }
              *pbVar13 = (bool)(*pbVar13 | bVar4);
              val = local_a0;
              pVVar14 = local_b0;
            }
          }
LAB_0011fb83:
          ppIVar15 = ppIVar15 + 1;
          pVVar3 = local_a0;
        } while (ppIVar15 != local_58);
        bVar2 = 0;
      }
LAB_0011fbd5:
      if (local_48.
          super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.
                        super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_48.
                              super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.
                              super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      local_68 = local_68 + 1;
    } while (!(bool)(bVar2 | local_68 == local_70));
  }
  return;
}

Assistant:

void RelationsAnalyzer::inferFromNonEquality(VRLocation &join,
                                             const VectorSet<V> &froms, Shift s,
                                             Handle placeholder) {
    const ValueRelations &predGraph = join.getTreePredecessor().relations;
    for (V from : froms) {
        Handle initH = predGraph.getPointedTo(from);
        for (const auto *icmp : getEQICmp(join)) {
            V compared;
            bool direct;
            std::tie(compared, direct) = getCompared(
                    codeGraph.getVRLocation(icmp).relations, icmp, from);
            if (!compared ||
                (!llvm::isa<llvm::Constant>(compared) &&
                 !codeGraph.getVRLocation(icmp)
                          .relations.getInstance<llvm::Argument>(compared)))
                continue;

            const llvm::Argument *arg = getArgument(predGraph, initH);
            if (!arg)
                continue;

            const llvm::Function *func = icmp->getFunction();

            ValueRelations &entryRels =
                    codeGraph.getEntryLocation(*func).relations;
            if (direct) {
                if (!join.relations.are(*predGraph.getEqual(initH).begin(),
                                        s == Shift::INC ? Relations::SLE
                                                        : Relations::SGE,
                                        compared)) {
                    structure.addPrecondition(func, arg,
                                              s == Shift::INC ? Relations::SLE
                                                              : Relations::SGE,
                                              compared);
                    entryRels.set(arg,
                                  s == Shift::INC ? Relations::SLE
                                                  : Relations::SGE,
                                  compared);
                }

                if (join.relations.are(arg, Relations::NE, compared))
                    join.relations.set(placeholder,
                                       s == Shift::INC ? Relations::SLT
                                                       : Relations::SGT,
                                       compared);
                else
                    join.relations.set(placeholder,
                                       s == Shift::INC ? Relations::SLE
                                                       : Relations::SGE,
                                       compared);
            } else {
                if (structure.hasBorderValues(func)) {
                    for (const auto &borderVal :
                         structure.getBorderValuesFor(func)) {
                        if (borderVal.from == arg &&
                            borderVal.stored == compared) {
                            auto thisBorderPlaceholder =
                                    join.relations.getBorderH(borderVal.id);
                            assert(thisBorderPlaceholder);
                            join.relations.set(placeholder,
                                               s == Shift::INC ? Relations::SLE
                                                               : Relations::SGE,
                                               *thisBorderPlaceholder);
                            return;
                        }
                    }
                }

                auto id = structure.addBorderValue(func, arg, compared);
                Handle entryBorderPlaceholder = entryRels.newBorderBucket(id);
                entryRels.set(entryBorderPlaceholder, Relations::PT, compared);
                entryRels.set(entryBorderPlaceholder,
                              Relations::inverted(s == Shift::INC
                                                          ? Relations::SLE
                                                          : Relations::SGE),
                              arg);
            }
        }
    }
}